

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

bool __thiscall mat_lib::matrix<double>::operator==(matrix<double> *this,matrix<double> *m)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  element_t *peVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  uVar4 = this->rows__;
  if (uVar4 == m->rows__) {
    uVar5 = this->columns__;
    uVar6 = m->columns__;
    if (uVar5 == uVar6) {
      bVar12 = uVar4 == 0;
      if (bVar12) {
        return bVar12;
      }
      peVar7 = m->elements__ + 1;
      uVar10 = 0;
      do {
        if (uVar5 != 0) {
          dVar3 = this->elements__[uVar10 * uVar5];
          pdVar2 = m->elements__ + uVar10 * uVar6;
          bVar11 = uVar5 != 0;
          if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) {
            lVar9 = 0x100000000;
            uVar8 = 0;
            do {
              if (uVar5 - 1 == uVar8) goto LAB_0015136c;
              dVar3 = *(double *)((long)this->elements__ + (lVar9 >> 0x1d) + uVar10 * uVar5 * 8);
              lVar9 = lVar9 + 0x100000000;
              uVar1 = uVar8 + 1;
              pdVar2 = peVar7 + uVar8;
            } while ((dVar3 == *pdVar2) && (uVar8 = uVar1, !NAN(dVar3) && !NAN(*pdVar2)));
            bVar11 = uVar1 < uVar5;
          }
          if (bVar11) {
            return bVar12;
          }
        }
LAB_0015136c:
        uVar10 = uVar10 + 1;
        peVar7 = peVar7 + uVar6;
        bVar12 = uVar4 <= uVar10;
        if (uVar10 == uVar4) {
          return bVar12;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool matrix<T>::operator==(const matrix<T>& m) const
  {
    if((rows__!=m.rows()) || (columns__!=m.columns())) return false; 

    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) 
        if(elements__[offset__(i,j)]!=m[i][j]) return false;
    
    return true;
  }